

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setprecision _Var1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  ostream *poVar3;
  void *this;
  rep rVar4;
  anon_class_16_2_5298c5d0 aVar5;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c0;
  duration<long,_std::ratio<1L,_1000L>_> local_b8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> elapsed;
  int local_80;
  int local_7c;
  int failure;
  int success;
  int local_64;
  undefined1 local_60 [4];
  int retVal;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> lw;
  string workDir;
  Options local_28;
  Options options;
  time_point startTime;
  char **argv_local;
  int argc_local;
  
  options = (Options)std::chrono::_V2::system_clock::now();
  cinemo::args::printCopyrights();
  cinemo::args::Options::Options(&local_28);
  std::__cxx11::string::string
            ((string *)
             &lw.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::vector
            ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)local_60);
  local_64 = cinemo::args::processArgs
                       (argc,argv,&local_28,
                        (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                        local_60);
  argv_local._4_4_ = local_64;
  if (local_64 < 1) {
    sVar2 = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::size
                      ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                       local_60);
    if (sVar2 == 0) {
      argv_local._4_4_ = 0;
    }
    else {
      if ((local_28.noThread & 1U) == 0) {
        cinemo::threading::doMultiThreadedConversion
                  ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)local_60
                   ,&local_28);
      }
      else {
        cinemo::threading::doSingleThreadedConversion
                  ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)local_60
                   ,&local_28);
      }
      local_7c = 0;
      local_80 = 0;
      __first = std::begin<std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>
                          ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                           local_60);
      __last = std::end<std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>
                         ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                          local_60);
      aVar5.failure = &local_80;
      aVar5.success = &local_7c;
      aVar5 = std::
              for_each<__gnu_cxx::__normal_iterator<cinemo::LameWrapper**,std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>,main::__0>
                        ((__normal_iterator<cinemo::LameWrapper_**,_std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>_>
                          )__first._M_current,
                         (__normal_iterator<cinemo::LameWrapper_**,_std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>_>
                          )__last._M_current,aVar5);
      elapsed.__r = (rep)aVar5.success;
      poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
      poVar3 = std::operator<<(poVar3,"\nConversion Report:\n");
      poVar3 = std::operator<<(poVar3,"\nConverted:\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7c);
      poVar3 = std::operator<<(poVar3,"\nSkipped:\t");
      this = (void *)std::ostream::operator<<(poVar3,local_80);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_c0.__r = (rep)std::chrono::operator-
                                    (&local_c8,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&options);
      local_b8.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_c0);
      poVar3 = std::operator<<((ostream *)&std::cout,"Runtime:\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
      _Var1 = std::setprecision(3);
      poVar3 = std::operator<<(poVar3,_Var1);
      rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_b8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)rVar4 / 1000.0);
      poVar3 = std::operator<<(poVar3,"s\n");
      poVar3 = std::operator<<(poVar3,"-------------------------------------");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
    }
  }
  failure = 1;
  std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::~vector
            ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)local_60);
  std::__cxx11::string::~string
            ((string *)
             &lw.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {

	//Time measurement
	auto startTime = std::chrono::system_clock::now();

    args::printCopyrights();
    args::Options options;
    string workDir;
    vector<LameWrapper*> lw;

    int retVal = args::processArgs(argc, argv, options, lw);

    if (retVal > 0) { //error in arguments
        return retVal;
    }

    if (lw.size() == 0) { //no file to work on!
        return 0;
    }

    //Do the work
    if (!options.noThread) {
        threading::doMultiThreadedConversion(lw, options);
    } else { //single thread mode for comparison with -n switch
        threading::doSingleThreadedConversion(lw, options);
    }

	//write encoding results
	//TODO better to be moved into threading.cpp 
	int success = 0, failure = 0;
	for_each(begin(lw), end(lw), [&](const LameWrapper* item) {
		if (item->isFinished())
			success++;
		else {
			failure++;
			cout << "Error: '" << item->getFileName() << "' "
				<< item->getErrorMessage() << endl;
		}
	});

	cout << "-------------------------------------" 
		<< "\nConversion Report:\n"
		<< "\nConverted:\t" << success 
		<< "\nSkipped:\t" << failure << endl;

	//calculate and print total runtime
	auto elapsed = std::chrono::duration_cast<std::chrono::milliseconds>
		(std::chrono::system_clock::now() - startTime);

	cout << "Runtime:\t"
		<< std::fixed << std::setprecision(3) << elapsed.count() / 1000.0
		<< "s\n" 
		<< "-------------------------------------" << endl;

    return 0;
}